

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int lj_cf_debug_getlocal(lua_State *L)

{
  int32_t idx;
  int iVar1;
  lua_State *plVar2;
  lua_State *in_RDI;
  int slot;
  char *name;
  lua_Debug ar;
  lua_State *L1;
  int arg;
  lua_State *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  int level;
  lua_Debug *in_stack_ffffffffffffff68;
  lua_State *in_stack_ffffffffffffff70;
  int local_14;
  lua_State *local_10;
  int local_4;
  
  local_10 = in_RDI;
  plVar2 = getthread(in_RDI,&local_14);
  idx = lj_lib_checkint((lua_State *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                        (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  if (*(int *)((long)local_10->base + (long)local_14 * 8 + 4) == -9) {
    local_10->top = local_10->base + (long)local_14 + 1;
    lua_getlocal(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                 (int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    lua_pushstring((lua_State *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    local_4 = 1;
  }
  else {
    lj_lib_checkint((lua_State *)CONCAT44(idx,in_stack_ffffffffffffff58),
                    (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    level = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
    iVar1 = lua_getstack((lua_State *)in_stack_ffffffffffffff68,level,
                         (lua_Debug *)CONCAT44(idx,in_stack_ffffffffffffff58));
    if (iVar1 == 0) {
      lj_err_arg(in_stack_ffffffffffffff50,(int)((ulong)plVar2 >> 0x20),(ErrMsg)plVar2);
    }
    plVar2 = (lua_State *)lua_getlocal(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,level);
    if (plVar2 == (lua_State *)0x0) {
      *(undefined4 *)((long)local_10->top + -4) = 0xffffffff;
      local_4 = 1;
    }
    else {
      lua_xmove(plVar2,(lua_State *)CONCAT44(idx,in_stack_ffffffffffffff58),
                (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
      lua_pushstring((lua_State *)in_stack_ffffffffffffff68,(char *)plVar2);
      lua_pushvalue(plVar2,idx);
      local_4 = 2;
    }
  }
  return local_4;
}

Assistant:

LJLIB_CF(debug_getlocal)
{
  int arg;
  lua_State *L1 = getthread(L, &arg);
  lua_Debug ar;
  const char *name;
  int slot = lj_lib_checkint(L, arg+2);
  if (tvisfunc(L->base+arg)) {
    L->top = L->base+arg+1;
    lua_pushstring(L, lua_getlocal(L, NULL, slot));
    return 1;
  }
  if (!lua_getstack(L1, lj_lib_checkint(L, arg+1), &ar))
    lj_err_arg(L, arg+1, LJ_ERR_LVLRNG);
  name = lua_getlocal(L1, &ar, slot);
  if (name) {
    lua_xmove(L1, L, 1);
    lua_pushstring(L, name);
    lua_pushvalue(L, -2);
    return 2;
  } else {
    setnilV(L->top-1);
    return 1;
  }
}